

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void Parse(lemon *gp)

{
  byte *pbVar1;
  byte bVar2;
  ushort *puVar3;
  int iVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  FILE *__stream;
  ulong uVar8;
  byte *filebuf;
  size_t sVar9;
  long lVar10;
  long lVar11;
  byte *pbVar12;
  ushort **ppuVar13;
  rule *prVar14;
  symbol *psVar15;
  symbol **ppsVar16;
  symbol *psVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  long *__ptr;
  void *pvVar20;
  byte bVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  char *pcVar25;
  char cVar26;
  uint uVar27;
  byte *__s2;
  char **ppcVar28;
  char *pcVar29;
  int iVar30;
  uint uVar31;
  size_t sVar32;
  byte *pbVar33;
  ulong uVar34;
  byte *pbVar35;
  byte *pbVar36;
  long lVar37;
  bool bVar38;
  size_t local_3fb8;
  uint local_3fa8;
  int local_3fa4;
  char local_3f78 [56];
  char *local_3f40;
  uint local_3f38;
  int local_3f34;
  byte *local_3f30;
  lemon *local_3f28;
  undefined4 local_3f20;
  symbol *local_3f18;
  symbol *local_3f10;
  symbol *local_3f08;
  byte *local_3f00;
  uint local_3ef8;
  long alStack_3ef0 [999];
  undefined8 auStack_1fb8 [1001];
  rule *local_70;
  byte *local_68;
  char **local_60;
  int local_58;
  int *local_50;
  undefined4 local_48;
  int iStack_44;
  rule *prStack_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  memset(&local_3f38,0,0x3f08);
  pcVar25 = gp->filename;
  local_3f20 = 0;
  local_3f40 = pcVar25;
  local_3f28 = gp;
  __stream = fopen(pcVar25,"rb");
  if (__stream == (FILE *)0x0) {
    ErrorMsg(pcVar25,0,"Can\'t open this file for reading.");
    gp->errorcnt = gp->errorcnt + 1;
    return;
  }
  fseek(__stream,0,2);
  uVar8 = ftell(__stream);
  rewind(__stream);
  filebuf = (byte *)malloc((long)((uVar8 << 0x20) + 0x100000000) >> 0x20);
  if ((int)uVar8 < 0x5f5e101 && filebuf != (byte *)0x0) {
    sVar32 = (long)(uVar8 << 0x20) >> 0x20;
    sVar9 = fread(filebuf,1,sVar32,__stream);
    if (sVar9 == sVar32) {
      fclose(__stream);
      iVar7 = strip_crlf((char *)filebuf,(int)uVar8);
      filebuf[iVar7] = 0;
      ppcVar28 = azDefine;
      lVar10 = (long)nDefine;
      lVar37 = 0;
      uVar8 = 0;
      if (0 < nDefine) {
        uVar8 = (ulong)(uint)nDefine;
      }
      pbVar36 = filebuf + 6;
      uVar24 = 6;
      uVar27 = 0;
      local_3fa4 = 0;
      local_3fa8 = 1;
      uVar31 = 1;
      pbVar35 = filebuf;
      pbVar33 = filebuf;
      do {
        pbVar33 = pbVar33 + 1;
        bVar21 = filebuf[lVar37];
        if (bVar21 == 10) {
          uVar31 = uVar31 + 1;
        }
        else if (bVar21 == 0x25) {
          pbVar12 = filebuf + lVar37;
          if ((lVar37 == 0) || (pbVar12[-1] == 10)) {
            iVar7 = strncmp((char *)pbVar12,"%endif",6);
            if ((iVar7 == 0) &&
               (ppuVar13 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar13 + (ulong)pbVar12[6] * 2 + 1) & 0x20) != 0)) {
              pbVar12 = pbVar35;
              if (uVar27 == 0) {
                uVar27 = 0;
              }
              else {
                uVar27 = uVar27 - 1;
                if (uVar27 == 0) {
                  for (lVar11 = (long)local_3fa4; lVar11 < lVar37; lVar11 = lVar11 + 1) {
                    if (filebuf[lVar11] != 10) {
                      filebuf[lVar11] = 0x20;
                    }
                  }
                  uVar27 = 0;
                }
              }
              for (; (*pbVar12 != 0 && (*pbVar12 != 10)); pbVar12 = pbVar12 + 1) {
                *pbVar12 = 0x20;
              }
            }
            else {
              iVar7 = strncmp((char *)pbVar12,"%ifdef",6);
              if (((iVar7 == 0) &&
                  (ppuVar13 = __ctype_b_loc(),
                  (*(byte *)((long)*ppuVar13 + (ulong)pbVar12[6] * 2 + 1) & 0x20) != 0)) ||
                 ((iVar7 = strncmp((char *)pbVar12,"%ifndef",7), iVar7 == 0 &&
                  (ppuVar13 = __ctype_b_loc(),
                  (*(byte *)((long)*ppuVar13 + (ulong)pbVar12[7] * 2 + 1) & 0x20) != 0)))) {
                if (uVar27 == 0) {
                  ppuVar13 = __ctype_b_loc();
                  uVar22 = uVar24;
                  __s2 = pbVar36;
                  do {
                    pbVar1 = __s2 + 1;
                    __s2 = __s2 + 1;
                    uVar22 = uVar22 + 1;
                  } while ((*(byte *)((long)*ppuVar13 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
                  uVar34 = 0;
                  while (((ulong)filebuf[uVar34 + (uVar22 & 0xffffffff)] != 0 &&
                         ((*(byte *)((long)*ppuVar13 +
                                    (ulong)filebuf[uVar34 + (uVar22 & 0xffffffff)] * 2 + 1) & 0x20)
                          == 0))) {
                    uVar34 = uVar34 + 1;
                  }
                  for (uVar22 = 0; uVar8 != uVar22; uVar22 = uVar22 + 1) {
                    pcVar25 = ppcVar28[uVar22];
                    iVar7 = strncmp(pcVar25,(char *)__s2,uVar34 & 0xffffffff);
                    if ((iVar7 == 0) && (sVar9 = strlen(pcVar25), (int)sVar9 == (int)uVar34)) {
                      bVar38 = false;
                      goto LAB_00105f9f;
                    }
                  }
                  bVar38 = true;
                  uVar22 = uVar8;
LAB_00105f9f:
                  bVar5 = (long)uVar22 < lVar10;
                  if (pbVar12[3] != 0x6e) {
                    bVar5 = bVar38;
                  }
                  if (bVar5) {
                    local_3fa4 = (int)lVar37;
                    local_3fa8 = uVar31;
                  }
                  uVar27 = (uint)bVar5;
                }
                else {
                  uVar27 = uVar27 + 1;
                }
                bVar21 = 0x25;
                pbVar12 = pbVar33;
                while ((bVar21 != 0 && (bVar21 != 10))) {
                  pbVar12[-1] = 0x20;
                  bVar21 = *pbVar12;
                  pbVar12 = pbVar12 + 1;
                }
              }
            }
          }
        }
        else if (bVar21 == 0) goto LAB_0010604e;
        lVar37 = lVar37 + 1;
        pbVar35 = pbVar35 + 1;
        pbVar36 = pbVar36 + 1;
        uVar24 = uVar24 + 1;
      } while( true );
    }
    ErrorMsg(pcVar25,0,"Can\'t read in all %d bytes of this file.",uVar8 & 0xffffffff);
    free(filebuf);
  }
  else {
    ErrorMsg(pcVar25,0,"Input file too large.");
  }
  gp->errorcnt = gp->errorcnt + 1;
  fclose(__stream);
  return;
LAB_0010604e:
  if (uVar27 != 0) {
    fprintf(_stderr,"unterminated %%ifdef starting on line %d\n",(ulong)local_3fa8);
    exit(1);
  }
  pbVar36 = filebuf;
  uVar31 = 1;
LAB_00106060:
  do {
    uVar8 = (ulong)*pbVar36;
    pbVar33 = pbVar36;
    while( true ) {
      cVar26 = (char)uVar8;
      iVar7 = (int)uVar8;
      if (cVar26 == '\n') {
        uVar31 = uVar31 + 1;
      }
      else if (iVar7 == 0) {
        free(filebuf);
        gp->rule = prStack_40;
        gp->errorcnt = local_3f34;
        return;
      }
      ppuVar13 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar13 + uVar8 * 2 + 1) & 0x20) != 0) {
        pbVar36 = pbVar33 + 1;
        goto LAB_00106060;
      }
      pbVar35 = pbVar33;
      uVar27 = uVar31;
      if (cVar26 != '/') {
        if (cVar26 == '\"') {
          do {
            pbVar36 = pbVar35 + 1;
            do {
              pbVar35 = pbVar36;
              bVar21 = *pbVar35;
              if (bVar21 == 0) {
                local_3f38 = uVar31;
                local_3f30 = pbVar33;
                ErrorMsg(local_3f40,0,
                         "String starting on this line is not terminated before the end of the file."
                        );
                local_3f34 = local_3f34 + 1;
                pbVar36 = pbVar35;
                goto LAB_00106339;
              }
              pbVar36 = pbVar35 + 1;
              local_3f38 = uVar31;
              local_3f30 = pbVar33;
              if (bVar21 == 0x22) goto LAB_00106339;
            } while (bVar21 != 10);
            uVar27 = uVar27 + 1;
          } while( true );
        }
        if (iVar7 != 0x7b) goto LAB_0010621c;
        iVar7 = 1;
        goto LAB_0010611d;
      }
      if (pbVar33[1] != 0x2f) break;
      pbVar33 = pbVar33 + 2;
      while( true ) {
        bVar21 = *pbVar33;
        uVar8 = (ulong)bVar21;
        if ((bVar21 == 0) || (bVar21 == 10)) break;
        pbVar33 = pbVar33 + 1;
      }
    }
    if (pbVar33[1] != 0x2a) {
LAB_0010621c:
      puVar3 = *ppuVar13;
      if ((puVar3[uVar8] & 8) == 0) {
        if ((cVar26 == '/') || (iVar7 == 0x7c)) {
          if ((*(byte *)((long)puVar3 + (ulong)pbVar33[1] * 2 + 1) & 4) == 0) goto LAB_001062ac;
          pbVar35 = pbVar33 + 2;
          while ((uVar8 = (ulong)*pbVar35, pbVar36 = pbVar35, local_3f38 = uVar31,
                 local_3f30 = pbVar33, uVar8 != 0 && ((uVar8 == 0x5f || ((puVar3[uVar8] & 8) != 0)))
                 )) {
            pbVar35 = pbVar35 + 1;
          }
        }
        else if (((iVar7 == 0x3a) && (pbVar33[1] == 0x3a)) && (pbVar33[2] == 0x3d)) {
          pbVar35 = pbVar33 + 3;
          pbVar36 = pbVar35;
          local_3f38 = uVar31;
          local_3f30 = pbVar33;
        }
        else {
LAB_001062ac:
          pbVar35 = pbVar33 + 1;
          pbVar36 = pbVar35;
          local_3f38 = uVar31;
          local_3f30 = pbVar33;
        }
      }
      else {
        while ((uVar8 = (ulong)*pbVar35, pbVar36 = pbVar35, local_3f38 = uVar31,
               local_3f30 = pbVar33, uVar8 != 0 && ((uVar8 == 0x5f || ((puVar3[uVar8] & 8) != 0)))))
        {
          pbVar35 = pbVar35 + 1;
        }
      }
      goto LAB_00106339;
    }
    for (pbVar33 = pbVar33 + 2; bVar21 = *pbVar33, bVar21 != 0; pbVar33 = pbVar33 + 1) {
      if (bVar21 == 10) {
        uVar31 = uVar31 + 1;
      }
      else if ((bVar21 == 0x2f) && (pbVar33[-1] == 0x2a)) break;
    }
    pbVar36 = pbVar33 + (bVar21 != 0);
  } while( true );
LAB_0010611d:
  pbVar36 = pbVar35;
  pbVar35 = pbVar36 + 1;
  bVar21 = pbVar36[1];
  if (bVar21 != 0) {
    if ((iVar7 < 2) && (bVar21 == 0x7d)) {
      pbVar36 = pbVar36 + 2;
      local_3f38 = uVar31;
      local_3f30 = pbVar33;
      goto LAB_00106339;
    }
    if (bVar21 == 10) {
LAB_00106205:
      uVar27 = uVar27 + 1;
    }
    else if ((bVar21 == 0x22) || (bVar21 == 0x27)) {
      bVar6 = 0;
      for (pbVar35 = pbVar36 + 2;
          (bVar2 = *pbVar35, bVar2 != 0 && ((bVar6 == 0x5c || (bVar2 != bVar21))));
          pbVar35 = pbVar35 + 1) {
        uVar27 = uVar27 + (bVar2 == 10);
        bVar38 = bVar6 == 0x5c;
        bVar6 = bVar2;
        if (bVar38) {
          bVar6 = 0;
        }
      }
    }
    else if (bVar21 == 0x2f) {
      if (pbVar36[2] == 0x2f) {
        for (pbVar35 = pbVar36 + 3; *pbVar35 != 0; pbVar35 = pbVar35 + 1) {
          if (*pbVar35 == 10) goto LAB_00106205;
        }
      }
      else if (pbVar36[2] == 0x2a) {
        bVar21 = 0;
        for (pbVar35 = pbVar36 + 3;
            (bVar6 = *pbVar35, bVar6 != 0 && (bVar21 != 0x2a || bVar6 != 0x2f));
            pbVar35 = pbVar35 + 1) {
          uVar27 = uVar27 + (bVar6 == 10);
          bVar21 = bVar6;
        }
      }
    }
    else if (bVar21 == 0x7b) {
      iVar7 = iVar7 + 1;
    }
    else if (bVar21 == 0x7d) {
      iVar7 = iVar7 + -1;
    }
    goto LAB_0010611d;
  }
  local_3f38 = uVar31;
  local_3f30 = pbVar33;
  ErrorMsg(local_3f40,uVar31,
           "C code starting on this line is not terminated before the end of the file.");
  local_3f34 = local_3f34 + 1;
  pbVar36 = pbVar35;
LAB_00106339:
  bVar21 = *pbVar35;
  *pbVar35 = 0;
  pbVar33 = (byte *)Strsafe((char *)local_3f30);
  prVar14 = local_70;
  uVar31 = local_3ef8;
  psVar15 = local_3f10;
  psVar17 = local_3f18;
  switch(local_3f20) {
  case 0:
    local_70 = (rule *)0x0;
    iStack_44 = 0;
    prStack_40 = (rule *)0x0;
    uStack_38 = 0;
    uStack_34 = 0;
    local_3f28->nrule = 0;
  case 1:
    uVar8 = (ulong)*pbVar33;
    if (uVar8 == 0x25) {
LAB_00106580:
      local_3f20 = 2;
    }
    else if ((*(byte *)((long)*ppuVar13 + uVar8 * 2 + 1) & 2) == 0) {
      if (uVar8 == 0x5b) {
        local_3f20 = 0xc;
      }
      else {
        if (*pbVar33 == 0x7b) {
          if (local_70 == (rule *)0x0) {
            pcVar25 = 
            "There is no prior rule upon which to attach the code fragment which begins on this line."
            ;
          }
          else {
            if (local_70->code == (char *)0x0) {
              local_70->line = local_3f38;
              local_70->code = (char *)(pbVar33 + 1);
              local_70->noCode = 0;
              goto switchD_0010636f_default;
            }
            pcVar25 = 
            "Code fragment beginning on this line is not the first to follow the previous rule.";
          }
LAB_0010743d:
          ErrorMsg(local_3f40,local_3f38,pcVar25);
        }
        else {
          pcVar25 = "Token \"%s\" should be either \"%%\" or a nonterminal name.";
LAB_00107119:
          ErrorMsg(local_3f40,local_3f38,pcVar25,pbVar33);
        }
        local_3f34 = local_3f34 + 1;
        psVar17 = local_3f18;
      }
    }
    else {
      local_3f08 = Symbol_new((char *)pbVar33);
      local_3ef8 = 0;
      local_3f00 = (byte *)0x0;
      local_3f20 = 5;
      psVar17 = local_3f18;
    }
    goto switchD_0010636f_default;
  case 2:
    if ((*(byte *)((long)*ppuVar13 + (ulong)*pbVar33 * 2 + 1) & 4) != 0) {
      local_60 = (char **)0x0;
      local_50 = (int *)0x0;
      local_58 = 1;
      local_3f20 = 3;
      local_68 = pbVar33;
      iVar7 = strcmp((char *)pbVar33,"name");
      if (iVar7 == 0) {
        local_60 = &local_3f28->name;
        goto LAB_0010705b;
      }
      iVar7 = strcmp((char *)pbVar33,"include");
      if (iVar7 == 0) {
        local_60 = &local_3f28->include;
        psVar17 = local_3f18;
        goto switchD_0010636f_default;
      }
      iVar7 = strcmp((char *)pbVar33,"code");
      if (iVar7 == 0) {
        lVar10 = 0xa8;
      }
      else {
        iVar7 = strcmp((char *)pbVar33,"token_destructor");
        if (iVar7 == 0) {
          lVar10 = 0xb0;
        }
        else {
          iVar7 = strcmp((char *)pbVar33,"default_destructor");
          if (iVar7 == 0) {
            lVar10 = 0xb8;
          }
          else {
            iVar7 = strcmp((char *)pbVar33,"token_prefix");
            if (iVar7 == 0) {
              local_60 = &local_3f28->tokenprefix;
LAB_0010705b:
              local_58 = 0;
              psVar17 = local_3f18;
              goto switchD_0010636f_default;
            }
            iVar7 = strcmp((char *)pbVar33,"syntax_error");
            if (iVar7 == 0) {
              lVar10 = 0x88;
            }
            else {
              iVar7 = strcmp((char *)pbVar33,"parse_accept");
              if (iVar7 == 0) {
                lVar10 = 0xa0;
              }
              else {
                iVar7 = strcmp((char *)pbVar33,"parse_failure");
                if (iVar7 == 0) {
                  lVar10 = 0x98;
                }
                else {
                  iVar7 = strcmp((char *)pbVar33,"stack_overflow");
                  if (iVar7 != 0) {
                    iVar7 = strcmp((char *)pbVar33,"extra_argument");
                    if (iVar7 == 0) {
                      local_60 = &local_3f28->arg;
                    }
                    else {
                      iVar7 = strcmp((char *)pbVar33,"token_type");
                      if (iVar7 == 0) {
                        local_60 = &local_3f28->tokentype;
                      }
                      else {
                        iVar7 = strcmp((char *)pbVar33,"default_type");
                        if (iVar7 == 0) {
                          local_60 = &local_3f28->vartype;
                        }
                        else {
                          iVar7 = strcmp((char *)pbVar33,"stack_size");
                          if (iVar7 == 0) {
                            local_60 = &local_3f28->stacksize;
                          }
                          else {
                            iVar7 = strcmp((char *)pbVar33,"start_symbol");
                            if (iVar7 != 0) {
                              iVar7 = strcmp((char *)pbVar33,"left");
                              if (iVar7 == 0) {
                                iStack_44 = iStack_44 + 1;
                                local_48 = 0;
                              }
                              else {
                                iVar7 = strcmp((char *)pbVar33,"right");
                                if (iVar7 == 0) {
                                  iStack_44 = iStack_44 + 1;
                                  local_48 = 1;
                                }
                                else {
                                  iVar7 = strcmp((char *)pbVar33,"nonassoc");
                                  if (iVar7 != 0) {
                                    iVar7 = strcmp((char *)pbVar33,"destructor");
                                    if (iVar7 == 0) {
                                      local_3f20 = 0x10;
                                      psVar17 = local_3f18;
                                      goto switchD_0010636f_default;
                                    }
                                    iVar7 = strcmp((char *)pbVar33,"type");
                                    if (iVar7 == 0) {
                                      local_3f20 = 0x11;
                                      psVar17 = local_3f18;
                                      goto switchD_0010636f_default;
                                    }
                                    iVar7 = strcmp((char *)pbVar33,"fallback");
                                    if (iVar7 == 0) {
                                      local_3f18 = (symbol *)0x0;
                                      local_3f20 = 0x12;
                                      psVar17 = local_3f18;
                                      goto switchD_0010636f_default;
                                    }
                                    iVar7 = strcmp((char *)pbVar33,"wildcard");
                                    if (iVar7 == 0) {
                                      local_3f20 = 0x13;
                                      psVar17 = local_3f18;
                                      goto switchD_0010636f_default;
                                    }
                                    iVar7 = strcmp((char *)pbVar33,"token_class");
                                    if (iVar7 == 0) {
                                      local_3f20 = 0x14;
                                      psVar17 = local_3f18;
                                      goto switchD_0010636f_default;
                                    }
                                    pcVar25 = "Unknown declaration keyword: \"%%%s\".";
                                    break;
                                  }
                                  iStack_44 = iStack_44 + 1;
                                  local_48 = 2;
                                }
                              }
                              local_3f20 = 4;
                              psVar17 = local_3f18;
                              goto switchD_0010636f_default;
                            }
                            local_60 = &local_3f28->start;
                          }
                        }
                      }
                    }
                    goto LAB_0010705b;
                  }
                  lVar10 = 0x90;
                }
              }
            }
          }
        }
      }
      local_60 = (char **)((long)&local_3f28->sorted + lVar10);
      psVar17 = local_3f18;
      goto switchD_0010636f_default;
    }
    pcVar25 = "Illegal declaration keyword: \"%s\".";
    break;
  case 3:
    bVar6 = *pbVar33;
    if (((bVar6 == 0x22) || (bVar6 == 0x7b)) || (((*ppuVar13)[bVar6] & 8) != 0)) {
      if (((ulong)bVar6 == 0x7b) || (bVar6 == 0x22)) {
        pbVar33 = pbVar33 + 1;
      }
      sVar9 = strlen((char *)pbVar33);
      ppcVar28 = local_60;
      pcVar25 = *local_60;
      pcVar29 = pcVar25;
      if (pcVar25 == (char *)0x0) {
        pcVar29 = "";
      }
      sVar32 = strlen(pcVar29);
      iVar7 = (int)sVar9;
      iVar4 = (int)sVar32;
      iVar23 = iVar7 + iVar4 + 0x14;
      if ((local_3f28->nolinenosflag == 0) && (local_58 != 0)) {
        if ((local_50 == (int *)0x0) || (*local_50 != 0)) {
          iVar30 = 0;
          pcVar25 = local_3f40;
          do {
            if (*pcVar25 == '\\') {
              iVar30 = iVar30 + 1;
            }
            else if (*pcVar25 == '\0') goto LAB_00106e3f;
            pcVar25 = pcVar25 + 1;
          } while( true );
        }
        bVar38 = false;
        local_3fb8 = 0;
      }
      else {
        local_3fb8 = 0;
        bVar38 = false;
      }
      goto LAB_001071a6;
    }
    ErrorMsg(local_3f40,local_3f38,"Illegal argument to %%%s: %s",local_68);
    goto LAB_00106d4e;
  case 4:
    if ((ulong)*pbVar33 == 0x2e) goto LAB_00106893;
    if ((*(byte *)((long)*ppuVar13 + (ulong)*pbVar33 * 2 + 1) & 1) == 0) {
      pcVar25 = "Can\'t assign a precedence to \"%s\".";
    }
    else {
      psVar15 = Symbol_new((char *)pbVar33);
      if (psVar15->prec < 0) {
        psVar15->prec = iStack_44;
        psVar15->assoc = local_48;
        psVar17 = local_3f18;
        goto switchD_0010636f_default;
      }
      pcVar25 = "Symbol \"%s\" has already be given a precedence.";
    }
    goto LAB_00107119;
  case 5:
    if (*pbVar33 == 0x28) {
      local_3f20 = 7;
      goto switchD_0010636f_default;
    }
    if (((*pbVar33 == 0x3a) && (pbVar33[1] == 0x3a)) && (pbVar33[2] == 0x3d)) goto LAB_001063cb;
    pbVar33 = (byte *)local_3f08->name;
    pcVar25 = "Expected to see a \":\" following the LHS symbol \"%s\".";
    goto LAB_001067e0;
  case 6:
    bVar6 = *pbVar33;
    uVar8 = (ulong)bVar6;
    if (uVar8 == 0x2e) {
      lVar10 = (long)(int)local_3ef8;
      prVar14 = (rule *)calloc(lVar10 * 0x10 + 0x80,1);
      if (prVar14 == (rule *)0x0) {
        ErrorMsg(local_3f40,local_3f38,"Can\'t allocate enough memory for this rule.");
        local_3f34 = local_3f34 + 1;
        local_70 = prVar14;
      }
      else {
        prVar14->ruleline = local_3f38;
        prVar14->rhs = &prVar14[1].lhs;
        prVar14->rhsalias = (char **)(&prVar14[1].lhs + lVar10);
        uVar8 = 0;
        if (0 < (int)uVar31) {
          uVar8 = (ulong)uVar31;
        }
        for (uVar24 = 0; uVar8 != uVar24; uVar24 = uVar24 + 1) {
          prVar14->rhs[uVar24] = (symbol *)alStack_3ef0[uVar24];
          prVar14->rhsalias[uVar24] = (char *)auStack_1fb8[uVar24 + 1];
        }
        prVar14->lhs = local_3f08;
        prVar14->lhsalias = (char *)local_3f00;
        prVar14->nrhs = uVar31;
        prVar14->code = (char *)0x0;
        prVar14->noCode = 1;
        prVar14->precsym = (symbol *)0x0;
        iVar7 = local_3f28->nrule;
        local_3f28->nrule = iVar7 + 1;
        prVar14->index = iVar7;
        prVar14->nextlhs = local_3f08->rule;
        local_3f08->rule = prVar14;
        prVar14->next = (rule *)0x0;
        puVar18 = (undefined8 *)(CONCAT44(uStack_34,uStack_38) + 0x78);
        if (prStack_40 == (rule *)0x0) {
          puVar18 = (undefined8 *)&uStack_38;
        }
        *puVar18 = prVar14;
        (&prStack_40)[prStack_40 != (rule *)0x0] = prVar14;
        local_70 = prVar14;
      }
      goto LAB_0010726b;
    }
    if ((*(byte *)((long)*ppuVar13 + uVar8 * 2 + 1) & 4) != 0) {
      lVar10 = (long)(int)local_3ef8;
      if (lVar10 < 1000) {
        psVar15 = Symbol_new((char *)pbVar33);
        alStack_3ef0[lVar10] = (long)psVar15;
        auStack_1fb8[lVar10 + 1] = 0;
        local_3ef8 = uVar31 + 1;
        psVar17 = local_3f18;
      }
      else {
        ErrorMsg(local_3f40,local_3f38,"Too many symbols on RHS of rule beginning at \"%s\".",
                 pbVar33);
        local_3f34 = local_3f34 + 1;
        local_3f20 = 0xe;
        psVar17 = local_3f18;
      }
      goto switchD_0010636f_default;
    }
    if (uVar8 == 0x28) {
      if (0 < (int)local_3ef8) {
        local_3f20 = 10;
        goto switchD_0010636f_default;
      }
LAB_001072f0:
      ErrorMsg(local_3f40,local_3f38,"Illegal character on RHS of rule: \"%s\".",pbVar33);
      local_3f34 = local_3f34 + 1;
      local_3f20 = 0xe;
      psVar17 = local_3f18;
      goto switchD_0010636f_default;
    }
    if (((bVar6 != 0x7c) && (bVar6 != 0x2f)) || ((int)local_3ef8 < 1)) goto LAB_001072f0;
    uVar31 = local_3ef8 - 1;
    puVar18 = (undefined8 *)alStack_3ef0[uVar31];
    if (*(int *)((long)puVar18 + 0xc) == 2) {
      __ptr = (long *)puVar18[0xb];
      iVar7 = *(int *)((long)puVar18 + 0x54) + 1;
      puVar19 = puVar18;
    }
    else {
      puVar19 = (undefined8 *)calloc(1,0x60);
      *(undefined4 *)((long)puVar19 + 0xc) = 2;
      *(undefined4 *)((long)puVar19 + 0x54) = 1;
      __ptr = (long *)calloc(1,8);
      puVar19[0xb] = __ptr;
      *__ptr = (long)puVar18;
      *puVar19 = *puVar18;
      alStack_3ef0[uVar31] = (long)puVar19;
      iVar7 = 2;
    }
    *(int *)((long)puVar19 + 0x54) = iVar7;
    pvVar20 = realloc(__ptr,(long)iVar7 << 3);
    puVar19[0xb] = pvVar20;
    psVar15 = Symbol_new((char *)(pbVar33 + 1));
    *(symbol **)(puVar19[0xb] + -8 + (long)*(int *)((long)puVar19 + 0x54) * 8) = psVar15;
    if (((*(byte *)((long)*ppuVar13 + (ulong)pbVar33[1] * 2 + 1) & 2) == 0) &&
       (psVar17 = local_3f18,
       (*(byte *)((long)*ppuVar13 + (ulong)*(byte *)**(undefined8 **)puVar19[0xb] * 2 + 1) & 2) == 0
       )) goto switchD_0010636f_default;
    pcVar25 = "Cannot form a compound containing a non-terminal";
    goto LAB_0010743d;
  case 7:
    if ((*(byte *)((long)*ppuVar13 + (ulong)*pbVar33 * 2 + 1) & 4) != 0) {
      local_3f20 = 8;
      local_3f00 = pbVar33;
      goto switchD_0010636f_default;
    }
    pcVar25 = "\"%s\" is not a valid alias for the LHS \"%s\"\n";
    goto LAB_001067a3;
  case 8:
    if (*pbVar33 == 0x29) {
      local_3f20 = 9;
      goto switchD_0010636f_default;
    }
    goto LAB_001067c2;
  case 9:
    if (((*pbVar33 == 0x3a) && (pbVar33[1] == 0x3a)) && (pbVar33[2] == 0x3d)) {
LAB_001063cb:
      local_3f20 = 6;
      goto switchD_0010636f_default;
    }
    pbVar33 = (byte *)local_3f08->name;
    pcVar25 = "Missing \"->\" following: \"%s(%s)\".";
    goto LAB_001067a3;
  case 10:
    if ((*(byte *)((long)*ppuVar13 + (ulong)*pbVar33 * 2 + 1) & 4) != 0) {
      auStack_1fb8[(int)local_3ef8] = pbVar33;
      local_3f20 = 0xb;
      goto switchD_0010636f_default;
    }
    pcVar25 = "\"%s\" is not a valid alias for the RHS symbol \"%s\"\n";
LAB_001067a3:
    ErrorMsg(local_3f40,local_3f38,pcVar25,pbVar33);
LAB_001067e7:
    local_3f34 = local_3f34 + 1;
    local_3f20 = 0xe;
    psVar17 = local_3f18;
    goto switchD_0010636f_default;
  case 0xb:
    if (*pbVar33 == 0x29) goto LAB_001063cb;
LAB_001067c2:
    pcVar25 = "Missing \")\" following LHS alias name \"%s\".";
    pbVar33 = local_3f00;
LAB_001067e0:
    ErrorMsg(local_3f40,local_3f38,pcVar25,pbVar33);
    goto LAB_001067e7;
  case 0xc:
    if ((*(byte *)((long)*ppuVar13 + (ulong)*pbVar33 * 2 + 1) & 1) == 0) {
      ErrorMsg(local_3f40,local_3f38,"The precedence symbol must be a terminal.");
      local_3f34 = local_3f34 + 1;
    }
    else {
      if (local_70 == (rule *)0x0) {
        ErrorMsg(local_3f40,local_3f38,"There is no prior rule to assign precedence \"[%s]\".",
                 pbVar33);
      }
      else {
        if (local_70->precsym == (symbol *)0x0) {
          psVar15 = Symbol_new((char *)pbVar33);
          prVar14->precsym = psVar15;
          goto LAB_00107169;
        }
        ErrorMsg(local_3f40,local_3f38,
                 "Precedence mark on this line is not the first to follow the previous rule.");
      }
      local_3f34 = local_3f34 + 1;
    }
LAB_00107169:
    local_3f20 = 0xd;
    psVar17 = local_3f18;
    goto switchD_0010636f_default;
  case 0xd:
    if (*pbVar33 != 0x5d) {
      ErrorMsg(local_3f40,local_3f38,"Missing \"]\" on precedence mark.");
      local_3f34 = local_3f34 + 1;
    }
    goto LAB_00106893;
  case 0xe:
  case 0xf:
    bVar6 = *pbVar33;
    if (bVar6 == 0x2e) {
      local_3f20 = 1;
      bVar6 = *pbVar33;
    }
    if (bVar6 != 0x25) goto switchD_0010636f_default;
    goto LAB_00106580;
  case 0x10:
    if ((*(byte *)((long)*ppuVar13 + (ulong)*pbVar33 * 2 + 1) & 4) != 0) {
      psVar15 = Symbol_new((char *)pbVar33);
      local_60 = &psVar15->destructor;
      local_50 = &psVar15->destLineno;
      local_58 = 1;
      local_3f20 = 3;
      psVar17 = local_3f18;
      goto switchD_0010636f_default;
    }
    pcVar25 = "Symbol name missing after %%destructor keyword";
    goto LAB_00106612;
  case 0x11:
    if ((*(byte *)((long)*ppuVar13 + (ulong)*pbVar33 * 2 + 1) & 4) != 0) {
      psVar15 = Symbol_find((char *)pbVar33);
      if (psVar15 == (symbol *)0x0) {
        psVar15 = Symbol_new((char *)pbVar33);
      }
      else if (psVar15->datatype != (char *)0x0) {
        ErrorMsg(local_3f40,local_3f38,"Symbol %%type \"%s\" already defined",pbVar33);
        local_3f34 = local_3f34 + 1;
        local_3f20 = 0xf;
        psVar17 = local_3f18;
        goto switchD_0010636f_default;
      }
      local_60 = &psVar15->datatype;
      local_58 = 0;
      local_3f20 = 3;
      psVar17 = local_3f18;
      goto switchD_0010636f_default;
    }
    pcVar25 = "Symbol name missing after %%type keyword";
LAB_00106612:
    ErrorMsg(local_3f40,local_3f38,pcVar25);
    goto LAB_00106d4e;
  case 0x12:
    if ((ulong)*pbVar33 != 0x2e) {
      if ((*(byte *)((long)*ppuVar13 + (ulong)*pbVar33 * 2 + 1) & 1) == 0) {
        pcVar25 = "%%fallback argument \"%s\" should be a token";
      }
      else {
        psVar17 = Symbol_new((char *)pbVar33);
        if (local_3f18 == (symbol *)0x0) goto switchD_0010636f_default;
        if (psVar17->fallback == (symbol *)0x0) {
          psVar17->fallback = local_3f18;
          local_3f28->has_fallback = 1;
          psVar17 = local_3f18;
          goto switchD_0010636f_default;
        }
        pcVar25 = "More than one fallback assigned to token %s";
      }
      goto LAB_00107119;
    }
    goto LAB_00106893;
  case 0x13:
    if ((ulong)*pbVar33 != 0x2e) {
      if ((*(byte *)((long)*ppuVar13 + (ulong)*pbVar33 * 2 + 1) & 1) == 0) {
        pcVar25 = "%%wildcard argument \"%s\" should be a token";
      }
      else {
        psVar15 = Symbol_new((char *)pbVar33);
        if (local_3f28->wildcard == (symbol *)0x0) {
          local_3f28->wildcard = psVar15;
          psVar17 = local_3f18;
          goto switchD_0010636f_default;
        }
        pcVar25 = "Extra wildcard to token: %s";
      }
      goto LAB_00107119;
    }
LAB_00106893:
    local_3f20 = 1;
    psVar17 = local_3f18;
    goto switchD_0010636f_default;
  case 0x14:
    if ((*(byte *)((long)*ppuVar13 + (ulong)*pbVar33 * 2 + 1) & 2) == 0) {
      pcVar25 = "%%token_class must be followed by an identifier: ";
    }
    else {
      psVar15 = Symbol_find((char *)pbVar33);
      if (psVar15 == (symbol *)0x0) {
        local_3f10 = Symbol_new((char *)pbVar33);
        local_3f10->type = MULTITERMINAL;
        local_3f20 = 0x15;
        psVar17 = local_3f18;
        goto switchD_0010636f_default;
      }
      pcVar25 = "Symbol \"%s\" already used";
    }
    break;
  case 0x15:
    uVar8 = (ulong)*pbVar33;
    if (uVar8 == 0x2e) goto LAB_00106893;
    if (((*(byte *)((long)*ppuVar13 + uVar8 * 2 + 1) & 1) != 0) ||
       (((uVar8 == 0x7c || (*pbVar33 == 0x2f)) &&
        ((*(byte *)((long)*ppuVar13 + (ulong)pbVar33[1] * 2 + 1) & 1) != 0)))) {
      iVar7 = local_3f10->nsubsym;
      local_3f10->nsubsym = iVar7 + 1;
      ppsVar16 = (symbol **)realloc(local_3f10->subsym,(long)iVar7 * 8 + 8);
      psVar15->subsym = ppsVar16;
      psVar17 = Symbol_new((char *)(pbVar33 + (((*ppuVar13)[*pbVar33] >> 8 & 1) == 0)));
      psVar15->subsym[(long)psVar15->nsubsym + -1] = psVar17;
      psVar17 = local_3f18;
      goto switchD_0010636f_default;
    }
    pcVar25 = "%%token_class argument \"%s\" should be a token";
    break;
  default:
    goto switchD_0010636f_default;
  }
  ErrorMsg(local_3f40,local_3f38,pcVar25,pbVar33);
LAB_00106d4e:
  local_3f34 = local_3f34 + 1;
  local_3f20 = 0xf;
  psVar17 = local_3f18;
switchD_0010636f_default:
  local_3f18 = psVar17;
  *pbVar35 = bVar21;
  uVar31 = uVar27;
  goto LAB_00106060;
LAB_00106e3f:
  sprintf(local_3f78,"#line %d ",(ulong)local_3f38);
  sVar9 = strlen(local_3f78);
  sVar32 = strlen(local_3f40);
  iVar23 = iVar30 + iVar23 + (int)sVar9 + (int)sVar32;
  local_3fb8 = (size_t)(int)sVar9;
  pcVar25 = *local_60;
  bVar38 = true;
  ppcVar28 = local_60;
LAB_001071a6:
  pcVar25 = (char *)realloc(pcVar25,(long)iVar23);
  *ppcVar28 = pcVar25;
  pcVar25 = *local_60 + iVar4;
  if (bVar38) {
    if ((iVar4 != 0) && (pcVar25[-1] != '\n')) {
      *pcVar25 = '\n';
      pcVar25 = pcVar25 + 1;
    }
    memcpy(pcVar25,local_3f78,local_3fb8);
    pcVar29 = pcVar25 + local_3fb8;
    pcVar25[local_3fb8] = '\"';
    pcVar25 = local_3f40;
    do {
      cVar26 = *pcVar25;
      if (cVar26 == '\\') {
        pcVar29[1] = '\\';
        pcVar29 = pcVar29 + 2;
        cVar26 = *pcVar25;
      }
      else {
        if (cVar26 == '\0') goto LAB_0010722d;
        pcVar29 = pcVar29 + 1;
      }
      *pcVar29 = cVar26;
      pcVar25 = pcVar25 + 1;
    } while( true );
  }
  goto LAB_0010723a;
LAB_0010722d:
  pcVar29[1] = '\"';
  pcVar29[2] = '\n';
  pcVar25 = pcVar29 + 3;
LAB_0010723a:
  if ((local_50 != (int *)0x0) && (*local_50 == 0)) {
    *local_50 = local_3f38;
  }
  memcpy(pcVar25,pbVar33,(long)iVar7);
  pcVar25[iVar7] = '\0';
LAB_0010726b:
  local_3f20 = 1;
  psVar17 = local_3f18;
  goto switchD_0010636f_default;
}

Assistant:

void Parse(struct lemon *gp)
{
  struct pstate ps;
  FILE *fp;
  char *filebuf;
  int filesize;
  int lineno;
  int c;
  char *cp, *nextcp;
  int startline = 0;

  memset(&ps, '\0', sizeof(ps));
  ps.gp = gp;
  ps.filename = gp->filename;
  ps.errorcnt = 0;
  ps.state = INITIALIZE;

  /* Begin by reading the input file */
  fp = fopen(ps.filename,"rb");
  if( fp==0 ){
    ErrorMsg(ps.filename,0,"Can't open this file for reading.");
    gp->errorcnt++;
    return;
  }
  fseek(fp,0,2);
  filesize = ftell(fp);
  rewind(fp);
  filebuf = (char *)malloc( filesize+1 );
  if( filesize>100000000 || filebuf==0 ){
    ErrorMsg(ps.filename,0,"Input file too large.");
    gp->errorcnt++;
    fclose(fp);
    return;
  }
  if( fread(filebuf,1,filesize,fp)!=filesize ){
    ErrorMsg(ps.filename,0,"Can't read in all %d bytes of this file.",
      filesize);
    free(filebuf);
    gp->errorcnt++;
    fclose(fp);
    return;
  }
  fclose(fp);
  filesize = strip_crlf(filebuf, filesize);
  filebuf[filesize] = 0;

  /* Make an initial pass through the file to handle %ifdef and %ifndef */
  preprocess_input(filebuf);

  /* Now scan the text of the input file */
  lineno = 1;
  for(cp=filebuf; (c= *cp)!=0; ){
    if( c=='\n' ) lineno++;              /* Keep track of the line number */
    if( ISSPACE(c) ){ cp++; continue; }  /* Skip all white space */
    if( c=='/' && cp[1]=='/' ){          /* Skip C++ style comments */
      cp+=2;
      while( (c= *cp)!=0 && c!='\n' ) cp++;
      continue;
    }
    if( c=='/' && cp[1]=='*' ){          /* Skip C style comments */
      cp+=2;
      while( (c= *cp)!=0 && (c!='/' || cp[-1]!='*') ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c ) cp++;
      continue;
    }
    ps.tokenstart = cp;                /* Mark the beginning of the token */
    ps.tokenlineno = lineno;           /* Linenumber on which token begins */
    if( c=='\"' ){                     /* String literals */
      cp++;
      while( (c= *cp)!=0 && c!='\"' ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c==0 ){
        ErrorMsg(ps.filename,startline,
"String starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( c=='{' ){               /* A block of C code */
      int level;
      cp++;
      for(level=1; (c= *cp)!=0 && (level>1 || c!='}'); cp++){
        if( c=='\n' ) lineno++;
        else if( c=='{' ) level++;
        else if( c=='}' ) level--;
        else if( c=='/' && cp[1]=='*' ){  /* Skip comments */
          int prevc;
          cp = &cp[2];
          prevc = 0;
          while( (c= *cp)!=0 && (c!='/' || prevc!='*') ){
            if( c=='\n' ) lineno++;
            prevc = c;
            cp++;
	  }
	}else if( c=='/' && cp[1]=='/' ){  /* Skip C++ style comments too */
          cp = &cp[2];
          while( (c= *cp)!=0 && c!='\n' ) cp++;
          if( c ) lineno++;
	}else if( c=='\'' || c=='\"' ){    /* String a character literals */
          int startchar, prevc;
          startchar = c;
          prevc = 0;
          for(cp++; (c= *cp)!=0 && (c!=startchar || prevc=='\\'); cp++){
            if( c=='\n' ) lineno++;
            if( prevc=='\\' ) prevc = 0;
            else              prevc = c;
	  }
	}
      }
      if( c==0 ){
        ErrorMsg(ps.filename,ps.tokenlineno,
"C code starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( ISALNUM(c) ){          /* Identifiers */
      while( (c= *cp)!=0 && (ISALNUM(c) || c=='_') ) cp++;
      nextcp = cp;
    }else if( c==':' && cp[1]==':' && cp[2]=='=' ){ /* The operator "::=" */
      cp += 3;
      nextcp = cp;
    }else if( (c=='/' || c=='|') && ISALPHA(cp[1]) ){
      cp += 2;
      while( (c = *cp)!=0 && (ISALNUM(c) || c=='_') ) cp++;
      nextcp = cp;
    }else{                          /* All other (one character) operators */
      cp++;
      nextcp = cp;
    }
    c = *cp;
    *cp = 0;                        /* Null terminate the token */
    parseonetoken(&ps);             /* Parse the token */
    *cp = c;                        /* Restore the buffer */
    cp = nextcp;
  }
  free(filebuf);                    /* Release the buffer after parsing */
  gp->rule = ps.firstrule;
  gp->errorcnt = ps.errorcnt;
}